

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

char __thiscall json11::anon_unknown_21::JsonParser::get_next_token(JsonParser *this)

{
  size_type sVar1;
  allocator local_29;
  string local_28 [32];
  
  consume_garbage(this);
  if (this->failed == false) {
    sVar1 = this->i;
    if (sVar1 != this->str->_M_string_length) {
      this->i = sVar1 + 1;
      return (this->str->_M_dataplus)._M_p[sVar1];
    }
    std::__cxx11::string::string(local_28,"unexpected end of input",&local_29);
    if (this->failed == false) {
      std::__cxx11::string::operator=((string *)this->err,local_28);
    }
    this->failed = true;
    std::__cxx11::string::~string(local_28);
  }
  return '\0';
}

Assistant:

char get_next_token() {
        consume_garbage();
        if (failed) return static_cast<char>(0);
        if (i == str.size())
            return fail("unexpected end of input", static_cast<char>(0));

        return str[i++];
    }